

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

int amqp_ssl_socket_set_key_engine(amqp_socket_t *base,char *cert,char *key)

{
  int iVar1;
  EVP_PKEY *pkey_00;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  EVP_PKEY *pkey;
  amqp_ssl_socket_t *self;
  int status;
  int local_4;
  
  if ((amqp_socket_class_t *)*in_RDI != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t",in_RDI);
  }
  iVar1 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)in_RDI[1],in_RSI);
  if (iVar1 == 1) {
    pkey_00 = ENGINE_load_private_key((ENGINE *)openssl_engine,in_RDX,(UI_METHOD *)0x0,(void *)0x0);
    if (pkey_00 == (EVP_PKEY *)0x0) {
      local_4 = -0x200;
    }
    else {
      iVar1 = SSL_CTX_use_PrivateKey((SSL_CTX *)in_RDI[1],pkey_00);
      EVP_PKEY_free(pkey_00);
      if (iVar1 == 1) {
        local_4 = 0;
      }
      else {
        local_4 = -0x200;
      }
    }
  }
  else {
    local_4 = -0x200;
  }
  return local_4;
}

Assistant:

int amqp_ssl_socket_set_key_engine(amqp_socket_t *base, const char *cert,
                                   const char *key) {
#ifdef ENABLE_SSL_ENGINE_API
  int status;
  struct amqp_ssl_socket_t *self;
  EVP_PKEY *pkey = NULL;
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t", base);
  }
  self = (struct amqp_ssl_socket_t *)base;
  status = SSL_CTX_use_certificate_chain_file(self->ctx, cert);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }

  pkey = ENGINE_load_private_key(openssl_engine, key, NULL, NULL);
  if (pkey == NULL) {
    return AMQP_STATUS_SSL_ERROR;
  }

  status = SSL_CTX_use_PrivateKey(self->ctx, pkey);
  EVP_PKEY_free(pkey);

  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  return AMQP_STATUS_OK;
#else
  return AMQP_STATUS_SSL_UNIMPLEMENTED;
#endif
}